

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AttributeInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeInstanceSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *args_2,Token *args_3,
          Token *args_4)

{
  Token openStar;
  Token openParen;
  Token closeStar;
  Token closeParen;
  AttributeInstanceSyntax *pAVar1;
  undefined8 in_RCX;
  Info *in_RDX;
  undefined8 *in_RSI;
  Info *in_RDI;
  long in_R8;
  Info *in_R9;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pAVar1 = (AttributeInstanceSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  openParen.info = in_R9;
  openParen._0_8_ = in_RSI[1];
  openStar.info = (Info *)*in_RSI;
  openStar._0_8_ = in_RDX->location;
  closeStar.info = in_RDX;
  closeStar.kind = (short)in_RCX;
  closeStar._2_1_ = (char)((ulong)in_RCX >> 0x10);
  closeStar.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  closeStar.rawLen = (int)((ulong)in_RCX >> 0x20);
  closeParen.info = in_RDI;
  closeParen._0_8_ = in_RSI;
  slang::syntax::AttributeInstanceSyntax::AttributeInstanceSyntax
            ((AttributeInstanceSyntax *)in_RDX->rawTextPtr,openParen,openStar,
             *(SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> **)(in_R8 + 8),closeStar,
             closeParen);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }